

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O3

subtree_ref_base<false> * __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::subtree_ref_base<false>::child
          (subtree_ref_base<false> *__return_storage_ptr__,subtree_ref_base<false> *this,size_t k)

{
  size_t sVar1;
  size_t sVar2;
  word_type wVar3;
  size_t *psVar4;
  word_type wVar5;
  size_t sVar6;
  word_type wVar7;
  long lVar8;
  bt_impl_t *pbVar9;
  word_type wVar10;
  
  pbVar9 = this->_vector;
  sVar1 = (pbVar9->pointers)._width;
  lVar8 = (pbVar9->degree + 1) * this->_index;
  wVar3 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                    (&(pbVar9->pointers)._bits,(lVar8 + k) * sVar1,(lVar8 + 1 + k) * sVar1);
  sVar1 = this->_height;
  pbVar9 = this->_vector;
  if (k == 0) {
    sVar6 = (pbVar9->sizes)._width;
    lVar8 = pbVar9->degree * this->_index;
    wVar10 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                       (&(pbVar9->sizes)._bits,sVar6 * lVar8,(lVar8 + 1) * sVar6);
    pbVar9 = this->_vector;
    sVar6 = (pbVar9->ranks)._width;
    lVar8 = pbVar9->degree * this->_index;
    wVar5 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                      (&(pbVar9->ranks)._bits,sVar6 * lVar8,(lVar8 + 1) * sVar6);
  }
  else {
    if (pbVar9->degree == k) {
      wVar10 = this->_size;
      psVar4 = &this->_index;
      sVar6 = k;
    }
    else {
      lVar8 = pbVar9->degree * this->_index;
      sVar6 = (pbVar9->sizes)._width;
      wVar10 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
               get(&(pbVar9->sizes)._bits,(lVar8 + k) * sVar6,(lVar8 + 1 + k) * sVar6);
      pbVar9 = this->_vector;
      sVar6 = this->_index;
      psVar4 = &pbVar9->degree;
    }
    sVar2 = (pbVar9->sizes)._width;
    wVar5 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                      (&(pbVar9->sizes)._bits,(sVar6 * *psVar4 + -1 + k) * sVar2,
                       (sVar6 * *psVar4 + k) * sVar2);
    pbVar9 = this->_vector;
    wVar10 = wVar10 - wVar5;
    if (pbVar9->degree == k) {
      sVar6 = (pbVar9->ranks)._width;
      wVar5 = this->_rank;
      lVar8 = this->_index * k;
    }
    else {
      lVar8 = pbVar9->degree * this->_index;
      sVar6 = (pbVar9->ranks)._width;
      wVar5 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
              get(&(pbVar9->ranks)._bits,(lVar8 + k) * sVar6,(lVar8 + 1 + k) * sVar6);
      pbVar9 = this->_vector;
      sVar6 = (pbVar9->ranks)._width;
      lVar8 = pbVar9->degree * this->_index;
    }
    wVar7 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                      (&(pbVar9->ranks)._bits,(lVar8 + -1 + k) * sVar6,(lVar8 + k) * sVar6);
    wVar5 = wVar5 - wVar7;
  }
  __return_storage_ptr__->_vector = this->_vector;
  __return_storage_ptr__->_index = wVar3;
  __return_storage_ptr__->_height = sVar1 - 1;
  __return_storage_ptr__->_size = wVar10;
  __return_storage_ptr__->_rank = wVar5;
  return __return_storage_ptr__;
}

Assistant:

subtree_ref_base child(size_t k) const
            {
                assert(is_node());
                assert(k <= degree());
                assert(pointers(k) != 0);
                
                size_t p = pointers(k);
                size_t h = height() - 1;
                
                // Size of the subtree
                size_t s = k == 0        ? sizes(k) :
                           k == degree() ? size()   - sizes(k - 1) :
                                           sizes(k) - sizes(k - 1);
                
                // Rank of the subtree
                size_t r = k == 0        ? ranks(k) :
                           k == degree() ? rank()   - ranks(k - 1) :
                                           ranks(k) - ranks(k - 1);
                
                return { _vector, p, h, s, r };
            }